

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blurayHelper.cpp
# Opt level: O0

bool __thiscall
BlurayHelper::createMPLSFile
          (BlurayHelper *this,TSMuxer *mainMuxer,TSMuxer *subMuxer,int autoChapterLen,
          vector<double,_std::allocator<double>_> *customChapters,DiskType dt,int mplsOffset,
          bool isMvcBaseViewR)

{
  size_t *this_00;
  long lVar1;
  pointer plVar2;
  undefined8 uVar3;
  vector<double,_std::allocator<double>_> *this_01;
  bool bVar4;
  uint8_t uVar5;
  char cVar6;
  byte bVar7;
  int iVar8;
  reference plVar9;
  reference plVar10;
  PIDListMap *pPVar11;
  MPLSStreamInfo *pMVar12;
  reference __in;
  ostream *poVar13;
  File *this_02;
  undefined8 uVar14;
  PGSStreamReader *local_6e8;
  allocator<char> local_671;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  string local_650;
  string local_630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  allocator<char> local_5a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  allocator<char> local_581;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  allocator<char> local_559;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  undefined4 local_498;
  allocator<char> local_491;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  string local_470;
  string local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  allocator<char> local_3c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  allocator<char> local_3a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  undefined1 local_340 [8];
  string dstDir;
  AbstractOutputStream *file;
  undefined1 local_310 [8];
  string prefix;
  undefined1 local_2e8 [4];
  int fileLen;
  MPLSStreamInfo data;
  type *si_1;
  type *pid;
  _Self local_260;
  iterator __end2_1;
  iterator __begin2_1;
  PIDListMap *__range2_1;
  PMTStreamInfo *right;
  PMTStreamInfo *left;
  bool isSecondary;
  PGSStreamReader *pgStream;
  reference local_220;
  MPLSStreamInfo *info;
  type *si;
  type *index;
  _Self local_200;
  iterator __end1;
  iterator __begin1;
  PIDListMap *__range1;
  PIDListMap pidListMVC;
  PIDListMap pidList;
  int local_180;
  uint local_17c;
  reference pdStack_178;
  uint32_t mark;
  double *i;
  const_iterator __end2;
  const_iterator __begin2;
  vector<double,_std::allocator<double>_> *__range2;
  MPLSParser mplsParser;
  uint8_t *mplsBuffer;
  int bufSize;
  vector<long,_std::allocator<long>_> local_90;
  undefined1 local_78 [16];
  int64_t lastPts;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_50;
  long local_48;
  int64_t firstPts;
  bool isMvcBaseViewR_local;
  vector<double,_std::allocator<double>_> *pvStack_38;
  DiskType dt_local;
  vector<double,_std::allocator<double>_> *customChapters_local;
  TSMuxer *pTStack_28;
  int autoChapterLen_local;
  TSMuxer *subMuxer_local;
  TSMuxer *mainMuxer_local;
  BlurayHelper *this_local;
  
  firstPts._3_1_ = isMvcBaseViewR;
  firstPts._4_4_ = dt;
  pvStack_38 = customChapters;
  customChapters_local._4_4_ = autoChapterLen;
  pTStack_28 = subMuxer;
  subMuxer_local = mainMuxer;
  mainMuxer_local = (TSMuxer *)this;
  TSMuxer::getFirstPts((vector<long,_std::allocator<long>_> *)&lastPts,mainMuxer);
  local_50._M_current =
       (long *)std::vector<long,_std::allocator<long>_>::begin
                         ((vector<long,_std::allocator<long>_> *)&lastPts);
  plVar9 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
           operator*(&local_50);
  lVar1 = *plVar9;
  std::vector<long,_std::allocator<long>_>::~vector((vector<long,_std::allocator<long>_> *)&lastPts)
  ;
  local_48 = lVar1;
  TSMuxer::getLastPts(&local_90,subMuxer_local);
  std::vector<long,_std::allocator<long>_>::rbegin((vector<long,_std::allocator<long>_> *)local_78);
  plVar10 = std::
            reverse_iterator<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
            ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
                         *)local_78);
  plVar2 = (pointer)*plVar10;
  std::vector<long,_std::allocator<long>_>::~vector(&local_90);
  local_78._8_8_ = plVar2;
  mplsParser.m_mvcFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)operator_new__(0x19000);
  MPLSParser::MPLSParser((MPLSParser *)&__range2);
  mplsParser.m_marks.super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = TSMuxer::getFirstFileNum(subMuxer_local);
  __range2._0_4_ = 1;
  mplsParser.playback_count._1_1_ = 0;
  mplsParser._16_4_ = SUB84(local_48 / 2,0);
  mplsParser.m_chapterLen = (int)((long)local_78._8_8_ / 2);
  mplsParser.m_marks.super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_1_ = firstPts._3_1_ & 1;
  bVar4 = std::vector<double,_std::allocator<double>_>::empty(pvStack_38);
  this_01 = pvStack_38;
  if (bVar4) {
    mplsParser.is_multi_angle = (bool)customChapters_local._4_1_;
    mplsParser.ref_to_STC_id = customChapters_local._5_1_;
    mplsParser.PlayItem_random_access_flag = (bool)customChapters_local._6_1_;
    mplsParser.number_of_angles = customChapters_local._7_1_;
  }
  else {
    __end2 = std::vector<double,_std::allocator<double>_>::begin(pvStack_38);
    i = (double *)std::vector<double,_std::allocator<double>_>::end(this_01);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                                       *)&i), bVar4) {
      pdStack_178 = __gnu_cxx::
                    __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                    ::operator*(&__end2);
      local_17c = (uint)(long)(*pdStack_178 * 45000.0);
      if (local_17c <= (uint)(mplsParser.m_chapterLen - mplsParser._16_4_)) {
        local_180 = -1;
        pidList._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
             local_17c + mplsParser._16_4_;
        std::vector<PlayListMark,std::allocator<PlayListMark>>::emplace_back<int,unsigned_int>
                  ((vector<PlayListMark,std::allocator<PlayListMark>> *)
                   &mplsParser.m_streamInfoMVC.
                    super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&local_180,
                   (uint *)((long)&pidList._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
      }
      __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&__end2);
    }
  }
  mplsParser.playback_count._2_1_ = 0;
  pPVar11 = TSMuxer::getPidList(subMuxer_local);
  std::
  map<int,_PMTStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>::
  map((map<int,_PMTStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
       *)&pidListMVC._M_t._M_impl.super__Rb_tree_header._M_node_count,pPVar11);
  std::
  map<int,_PMTStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>::
  map((map<int,_PMTStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
       *)&__range1);
  if (pTStack_28 != (TSMuxer *)0x0) {
    pPVar11 = TSMuxer::getPidList(pTStack_28);
    std::
    map<int,_PMTStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>::
    operator=((map<int,_PMTStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
               *)&__range1,pPVar11);
  }
  this_00 = &pidListMVC._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __end1 = std::
           map<int,_PMTStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
           ::begin((map<int,_PMTStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
                    *)this_00);
  local_200._M_node =
       (_Base_ptr)
       std::
       map<int,_PMTStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
       ::end((map<int,_PMTStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
              *)this_00);
  while (bVar4 = std::operator!=(&__end1,&local_200), bVar4) {
    index = &std::_Rb_tree_iterator<std::pair<const_int,_PMTStreamInfo>_>::operator*(&__end1)->first
    ;
    si = (type *)std::get<0ul,int_const,PMTStreamInfo>((pair<const_int,_PMTStreamInfo> *)index);
    info = (MPLSStreamInfo *)
           std::get<1ul,int_const,PMTStreamInfo>((pair<const_int,_PMTStreamInfo> *)index);
    std::vector<MPLSStreamInfo,std::allocator<MPLSStreamInfo>>::emplace_back<PMTStreamInfo&>
              ((vector<MPLSStreamInfo,std::allocator<MPLSStreamInfo>> *)
               &mplsParser.m_playItems.
                super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(PMTStreamInfo *)info);
    std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::rbegin
              ((vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_> *)&pgStream);
    local_220 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<MPLSStreamInfo_*,_std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>_>_>
                ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<MPLSStreamInfo_*,_std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>_>_>
                             *)&pgStream);
    lVar1._0_1_ = info[1].type;
    lVar1._1_1_ = info[1].offsetId;
    lVar1._2_1_ = info[1].isSSPG;
    lVar1._3_1_ = info[1].field_0x43;
    lVar1._4_4_ = info[1].SS_PG_offset_sequence_id;
    if (lVar1 == 0) {
      local_6e8 = (PGSStreamReader *)0x0;
    }
    else {
      local_6e8 = (PGSStreamReader *)
                  __dynamic_cast(lVar1,&AbstractStreamReader::typeinfo,&PGSStreamReader::typeinfo,0)
      ;
    }
    if (local_6e8 != (PGSStreamReader *)0x0) {
      uVar5 = PGSStreamReader::getOffsetId(local_6e8);
      local_220->offsetId = uVar5;
      local_220->SS_PG_offset_sequence_id = local_6e8->ssPGOffset;
      local_220->isSSPG = (bool)(local_6e8->isSSPG & 1);
      if ((local_220->isSSPG & 1U) != 0) {
        right = streamByIndex(local_6e8->leftEyeSubStreamIdx,
                              (PIDListMap *)
                              &pidListMVC._M_t._M_impl.super__Rb_tree_header._M_node_count);
        bVar4 = right == (PMTStreamInfo *)0x0;
        if (bVar4) {
          right = streamByIndex(local_6e8->leftEyeSubStreamIdx,(PIDListMap *)&__range1);
        }
        if (right != (PMTStreamInfo *)0x0) {
          pMVar12 = (MPLSStreamInfo *)operator_new(0x70);
          MPLSStreamInfo::MPLSStreamInfo(pMVar12,right);
          local_220->leftEye = pMVar12;
          if (bVar4) {
            local_220->leftEye->type = '\x02';
          }
        }
        __range2_1 = (PIDListMap *)
                     streamByIndex(local_6e8->rightEyeSubStreamIdx,
                                   (PIDListMap *)
                                   &pidListMVC._M_t._M_impl.super__Rb_tree_header._M_node_count);
        bVar4 = (PMTStreamInfo *)__range2_1 == (PMTStreamInfo *)0x0;
        if (bVar4) {
          __range2_1 = (PIDListMap *)
                       streamByIndex(local_6e8->rightEyeSubStreamIdx,(PIDListMap *)&__range1);
        }
        if (__range2_1 != (PIDListMap *)0x0) {
          pMVar12 = (MPLSStreamInfo *)operator_new(0x70);
          MPLSStreamInfo::MPLSStreamInfo(pMVar12,(PMTStreamInfo *)__range2_1);
          local_220->rightEye = pMVar12;
          if (bVar4) {
            local_220->rightEye->type = '\x02';
          }
        }
      }
    }
    std::_Rb_tree_iterator<std::pair<const_int,_PMTStreamInfo>_>::operator++(&__end1);
  }
  if (pTStack_28 != (TSMuxer *)0x0) {
    mplsParser.m_marks.super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_1_ = 1;
    __end2_1 = std::
               map<int,_PMTStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
               ::begin((map<int,_PMTStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
                        *)&__range1);
    local_260._M_node =
         (_Base_ptr)
         std::
         map<int,_PMTStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
         ::end((map<int,_PMTStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
                *)&__range1);
    while (bVar4 = std::operator!=(&__end2_1,&local_260), bVar4) {
      __in = std::_Rb_tree_iterator<std::pair<const_int,_PMTStreamInfo>_>::operator*(&__end2_1);
      std::get<0ul,int_const,PMTStreamInfo>(__in);
      data._104_8_ = std::get<1ul,int_const,PMTStreamInfo>(__in);
      MPLSStreamInfo::MPLSStreamInfo((MPLSStreamInfo *)local_2e8,(PMTStreamInfo *)data._104_8_);
      data.super_M2TSStreamInfo.m_index.
      super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 2;
      std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::push_back
                ((vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_> *)
                 &mplsParser.m_streamInfo.
                  super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(value_type *)local_2e8);
      MPLSStreamInfo::~MPLSStreamInfo((MPLSStreamInfo *)local_2e8);
      std::_Rb_tree_iterator<std::pair<const_int,_PMTStreamInfo>_>::operator++(&__end2_1);
    }
  }
  if (firstPts._4_4_ == BLURAY) {
    poVar13 = std::operator<<((ostream *)&std::cout,"Creating Blu-ray playlist");
    std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar13 = std::operator<<((ostream *)&std::cout,"Creating AVCHD playlist");
    std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
  }
  sLastMsg = true;
  prefix.field_2._12_4_ =
       MPLSParser::compose((MPLSParser *)&__range2,
                           (uint8_t *)
                           mplsParser.m_mvcFiles.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,0x19000,firstPts._4_4_
                          );
  file._6_1_ = 0;
  if (this->m_isoWriter == (IsoWriter *)0x0) {
    std::__cxx11::string::string((string *)local_310,(string *)&this->m_dstPath);
  }
  else {
    std::allocator<char>::allocator();
    file._6_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_310,"",(allocator<char> *)((long)&file + 7));
  }
  if ((file._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&file + 7));
  }
  if (this->m_isoWriter == (IsoWriter *)0x0) {
    this_02 = (File *)operator_new(0x38);
    File::File(this_02);
    dstDir.field_2._8_8_ = this_02;
  }
  else {
    dstDir.field_2._8_8_ = IsoWriter::createFile(this->m_isoWriter);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a0,"BDMV",&local_3a1);
  cVar6 = getDirSeparator();
  std::operator+(&local_380,&local_3a0,cVar6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"PLAYLIST",&local_3c9);
  std::operator+(&local_360,&local_380,&local_3c8);
  cVar6 = getDirSeparator();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340,
                 &local_360,cVar6);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator(&local_3c9);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  uVar3 = dstDir.field_2._8_8_;
  std::operator+(&local_430,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340);
  int32ToStr_abi_cxx11_(&local_470,&mplsOffset);
  strPadLeft(&local_450,&local_470,5,'0');
  std::operator+(&local_410,&local_430,&local_450);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,".mpls",&local_491);
  std::operator+(&local_3f0,&local_410,&local_490);
  uVar14 = std::__cxx11::string::c_str();
  bVar7 = (**(code **)(*(long *)uVar3 + 0x10))(uVar3,uVar14,2,0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator(&local_491);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_430);
  if (((bVar7 ^ 0xff) & 1) == 0) {
    iVar8 = (**(code **)(*(long *)dstDir.field_2._8_8_ + 0x28))
                      (dstDir.field_2._8_8_,
                       mplsParser.m_mvcFiles.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,prefix.field_2._12_4_);
    if (iVar8 == prefix.field_2._12_4_) {
      (**(code **)(*(long *)dstDir.field_2._8_8_ + 0x18))();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_558,"BDMV",&local_559);
      cVar6 = getDirSeparator();
      std::operator+(&local_538,&local_558,cVar6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_580,"BACKUP",&local_581);
      std::operator+(&local_518,&local_538,&local_580);
      cVar6 = getDirSeparator();
      std::operator+(&local_4f8,&local_518,cVar6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a8,"PLAYLIST",&local_5a9)
      ;
      std::operator+(&local_4d8,&local_4f8,&local_5a8);
      cVar6 = getDirSeparator();
      std::operator+(&local_4b8,&local_4d8,cVar6);
      std::__cxx11::string::operator=((string *)local_340,(string *)&local_4b8);
      std::__cxx11::string::~string((string *)&local_4b8);
      std::__cxx11::string::~string((string *)&local_4d8);
      std::__cxx11::string::~string((string *)&local_5a8);
      std::allocator<char>::~allocator(&local_5a9);
      std::__cxx11::string::~string((string *)&local_4f8);
      std::__cxx11::string::~string((string *)&local_518);
      std::__cxx11::string::~string((string *)&local_580);
      std::allocator<char>::~allocator(&local_581);
      std::__cxx11::string::~string((string *)&local_538);
      std::__cxx11::string::~string((string *)&local_558);
      std::allocator<char>::~allocator(&local_559);
      uVar3 = dstDir.field_2._8_8_;
      std::operator+(&local_610,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340)
      ;
      int32ToStr_abi_cxx11_(&local_650,&mplsOffset);
      strPadLeft(&local_630,&local_650,5,'0');
      std::operator+(&local_5f0,&local_610,&local_630);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_670,".mpls",&local_671);
      std::operator+(&local_5d0,&local_5f0,&local_670);
      uVar14 = std::__cxx11::string::c_str();
      bVar7 = (**(code **)(*(long *)uVar3 + 0x10))(uVar3,uVar14,2,0);
      std::__cxx11::string::~string((string *)&local_5d0);
      std::__cxx11::string::~string((string *)&local_670);
      std::allocator<char>::~allocator(&local_671);
      std::__cxx11::string::~string((string *)&local_5f0);
      std::__cxx11::string::~string((string *)&local_630);
      std::__cxx11::string::~string((string *)&local_650);
      std::__cxx11::string::~string((string *)&local_610);
      if (((bVar7 ^ 0xff) & 1) == 0) {
        iVar8 = (**(code **)(*(long *)dstDir.field_2._8_8_ + 0x28))
                          (dstDir.field_2._8_8_,
                           mplsParser.m_mvcFiles.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,prefix.field_2._12_4_)
        ;
        if (iVar8 == prefix.field_2._12_4_) {
          (**(code **)(*(long *)dstDir.field_2._8_8_ + 0x18))();
          if (mplsParser.m_mvcFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            operator_delete__(mplsParser.m_mvcFiles.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          if (dstDir.field_2._8_8_ != 0) {
            (**(code **)(*(long *)dstDir.field_2._8_8_ + 8))();
          }
          this_local._7_1_ = 1;
        }
        else {
          (**(code **)(*(long *)dstDir.field_2._8_8_ + 0x18))();
          if (mplsParser.m_mvcFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            operator_delete__(mplsParser.m_mvcFiles.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          if (dstDir.field_2._8_8_ != 0) {
            (**(code **)(*(long *)dstDir.field_2._8_8_ + 8))();
          }
          this_local._7_1_ = 0;
        }
      }
      else {
        if (mplsParser.m_mvcFiles.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          operator_delete__(mplsParser.m_mvcFiles.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        if (dstDir.field_2._8_8_ != 0) {
          (**(code **)(*(long *)dstDir.field_2._8_8_ + 8))();
        }
        this_local._7_1_ = 0;
      }
    }
    else {
      (**(code **)(*(long *)dstDir.field_2._8_8_ + 0x18))();
      if (mplsParser.m_mvcFiles.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete__(mplsParser.m_mvcFiles.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      if (dstDir.field_2._8_8_ != 0) {
        (**(code **)(*(long *)dstDir.field_2._8_8_ + 8))();
      }
      this_local._7_1_ = 0;
    }
  }
  else {
    if (mplsParser.m_mvcFiles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete__(mplsParser.m_mvcFiles.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if (dstDir.field_2._8_8_ != 0) {
      (**(code **)(*(long *)dstDir.field_2._8_8_ + 8))();
    }
    this_local._7_1_ = 0;
  }
  local_498 = 1;
  std::__cxx11::string::~string((string *)local_340);
  std::__cxx11::string::~string((string *)local_310);
  std::
  map<int,_PMTStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>::
  ~map((map<int,_PMTStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
        *)&__range1);
  std::
  map<int,_PMTStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>::
  ~map((map<int,_PMTStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
        *)&pidListMVC._M_t._M_impl.super__Rb_tree_header._M_node_count);
  MPLSParser::~MPLSParser((MPLSParser *)&__range2);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool BlurayHelper::createMPLSFile(TSMuxer* mainMuxer, TSMuxer* subMuxer, int autoChapterLen,
                                  const vector<double>& customChapters, DiskType dt, int mplsOffset,
                                  bool isMvcBaseViewR) const
{
    int64_t firstPts = *(mainMuxer->getFirstPts().begin());
    int64_t lastPts = *(mainMuxer->getLastPts().rbegin());

    int bufSize = 1024 * 100;
    auto mplsBuffer = new uint8_t[bufSize];
    MPLSParser mplsParser;
    mplsParser.m_m2tsOffset = mainMuxer->getFirstFileNum();
    mplsParser.PlayList_playback_type = 1;
    mplsParser.ref_to_STC_id = 0;
    mplsParser.IN_time = static_cast<uint32_t>(firstPts / 2);
    mplsParser.OUT_time = static_cast<uint32_t>(lastPts / 2);
    mplsParser.mvc_base_view_r = isMvcBaseViewR;

    if (customChapters.empty())
    {
        mplsParser.m_chapterLen = autoChapterLen;
    }
    else
    {
        for (auto& i : customChapters)
        {
            auto mark = static_cast<uint32_t>(i * 45000.0);
            if (mark <= (mplsParser.OUT_time - mplsParser.IN_time))
                mplsParser.m_marks.emplace_back(-1, mark + mplsParser.IN_time);
        }
    }
    mplsParser.PlayItem_random_access_flag = false;
    PIDListMap pidList = mainMuxer->getPidList();
    PIDListMap pidListMVC;
    if (subMuxer)
        pidListMVC = subMuxer->getPidList();

    for (auto& [index, si] : pidList)
    {
        mplsParser.m_streamInfo.emplace_back(si);
        MPLSStreamInfo& info = *mplsParser.m_streamInfo.rbegin();
        auto pgStream = dynamic_cast<PGSStreamReader*>(si.m_codecReader);
        if (pgStream)
        {
            info.offsetId = pgStream->getOffsetId();
            info.SS_PG_offset_sequence_id = pgStream->ssPGOffset;
            info.isSSPG = pgStream->isSSPG;
            if (info.isSSPG)
            {
                bool isSecondary = false;
                const PMTStreamInfo* left = streamByIndex(pgStream->leftEyeSubStreamIdx, pidList);
                if (!left)
                {
                    left = streamByIndex(pgStream->leftEyeSubStreamIdx, pidListMVC);
                    isSecondary = true;
                }
                if (left)
                {
                    info.leftEye = new MPLSStreamInfo(*left);
                    if (isSecondary)
                        info.leftEye->type = 2;  // ref to subclip
                }

                isSecondary = false;
                const PMTStreamInfo* right = streamByIndex(pgStream->rightEyeSubStreamIdx, pidList);
                if (!right)
                {
                    right = streamByIndex(pgStream->rightEyeSubStreamIdx, pidListMVC);
                    isSecondary = true;
                }
                if (right)
                {
                    info.rightEye = new MPLSStreamInfo(*right);
                    if (isSecondary)
                        info.rightEye->type = 2;  // ref to subclip
                }
            }
        }
    }
    if (subMuxer)
    {
        mplsParser.isDependStreamExist = true;
        for (const auto& [pid, si] : pidListMVC)
        {
            MPLSStreamInfo data(si);
            data.type = 2;  // Identify an elementary stream of the Clip used by a SubPath with SubPath_type set to
                            // 2,3,4,5,6,8 or 9
            mplsParser.m_streamInfoMVC.push_back(data);
        }
    }

    if (dt == DiskType::BLURAY)
    {
        LTRACE(LT_INFO, 2, "Creating Blu-ray playlist");
    }
    else
    {
        LTRACE(LT_INFO, 2, "Creating AVCHD playlist");
    }
    int fileLen = mplsParser.compose(mplsBuffer, bufSize, dt);

    string prefix = m_isoWriter ? "" : m_dstPath;
    AbstractOutputStream* file;
    if (m_isoWriter)
        file = m_isoWriter->createFile();
    else
        file = new File();

    string dstDir = string("BDMV") + getDirSeparator() + string("PLAYLIST") + getDirSeparator();
    if (!file->open((prefix + dstDir + strPadLeft(int32ToStr(mplsOffset), 5, '0') + string(".mpls")).c_str(),
                    File::ofWrite))
    {
        delete[] mplsBuffer;
        delete file;
        return false;
    }
    if (file->write(mplsBuffer, fileLen) != fileLen)
    {
        file->close();
        delete[] mplsBuffer;
        delete file;
        return false;
    }
    file->close();

    dstDir = string("BDMV") + getDirSeparator() + string("BACKUP") + getDirSeparator() + string("PLAYLIST") +
             getDirSeparator();
    if (!file->open((prefix + dstDir + strPadLeft(int32ToStr(mplsOffset), 5, '0') + string(".mpls")).c_str(),
                    File::ofWrite))
    {
        delete[] mplsBuffer;
        delete file;
        return false;
    }
    if (file->write(mplsBuffer, fileLen) != fileLen)
    {
        file->close();
        delete[] mplsBuffer;
        delete file;
        return false;
    }
    file->close();
    delete[] mplsBuffer;
    delete file;
    return true;
}